

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_SpawnBlood(DVector3 *pos1,DAngle *dir,int damage,AActor *originator)

{
  byte *pbVar1;
  FState *newstate;
  uint kind;
  FState *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  SDWORD SVar7;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *this;
  FState *pFVar8;
  undefined4 extraout_var_00;
  uint uVar9;
  ulong uVar10;
  PClass *pPVar11;
  DVector3 pos;
  DVector3 local_58;
  FName local_3c;
  DAngle local_38;
  
  if ((originator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
    (originator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
  }
  kind = *(uint *)&(originator->super_DThinker).super_DObject.Class[1].super_PStruct.
                   super_PNamedType.super_PCompoundType.super_PType.VisitNext;
  type = AActor::GetBloodType(originator,0);
  local_58.X = pos1->X;
  local_58.Y = pos1->Y;
  local_58.Z = pos1->Z;
  uVar5 = FRandom::GenRand32(&pr_spawnblood);
  uVar6 = FRandom::GenRand32(&pr_spawnblood);
  local_58.Z = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625 + local_58.Z;
  uVar5 = cl_bloodtype.Value;
  if (type == (PClassActor *)0x0) goto LAB_0052849f;
  uVar5 = cl_bloodtype.Value & (*(int *)((type->super_PClass).Defaults + 0x198) << 4) >> 0x1f;
  this = AActor::StaticSpawn(type,&local_58,NO_REPLACE,false);
  (this->Vel).Z = 2.0;
  (this->Angles).Yaw.Degrees = dir->Degrees;
  if (((this->flags5).Value & 0x800000) != 0) {
    (this->target).field_0.p = originator;
  }
  if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    uVar6 = FRandom::GenRand32(&pr_spawnblood);
    iVar4 = this->tics - (uVar6 & 3);
    SVar7 = 1;
    if (1 < iVar4) {
      SVar7 = iVar4;
    }
    this->tics = SVar7;
  }
  if ((kind != 0) && (((this->flags2).Value & 0x10000) == 0)) {
    this->Translation = kind >> 0x18 | 0x80000;
  }
  if ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) {
    if (gameinfo.gametype == GAME_Strife) {
      if (damage < 0xe) {
        damage = damage + 2;
      }
      else {
        local_3c.Index = 0x10;
        pFVar8 = AActor::FindState(this,&local_3c);
        if (pFVar8 != (FState *)0x0) {
          AActor::SetState(this,pFVar8,false);
          goto LAB_00528492;
        }
      }
    }
    uVar6 = 1;
    if (3 < damage - 9U) {
      uVar6 = (uint)(damage < 9) * 2;
    }
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    pPVar11 = (this->super_DThinker).super_DObject.Class;
    do {
      if (pPVar11 == AActor::RegistrationInfo.MyClass) break;
      if (damage < 0xd) {
        pFVar8 = this->SpawnState;
        pFVar2 = (FState *)
                 pPVar11[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                 super_DObject._vptr_DObject;
        if ((pFVar2 <= pFVar8) &&
           (pFVar8 < pFVar2 + *(int *)&pPVar11[1].super_PStruct.super_PNamedType.super_PCompoundType
                                       .super_PType.super_DObject.GCNext)) {
          uVar10 = (ulong)uVar6;
          do {
            uVar9 = (uint)uVar10;
            newstate = pFVar8 + uVar10;
            if ((pFVar2 <= newstate) &&
               (newstate <
                pFVar2 + *(int *)&pPVar11[1].super_PStruct.super_PNamedType.super_PCompoundType.
                                  super_PType.super_DObject.GCNext)) {
              bVar3 = false;
              AActor::SetState(this,newstate,false);
              goto LAB_0052848d;
            }
            uVar10 = 1;
          } while (1 < uVar9);
        }
      }
      pPVar11 = pPVar11->ParentClass;
      bVar3 = true;
LAB_0052848d:
    } while (bVar3);
  }
LAB_00528492:
  if (1 < (int)uVar5) {
    pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
LAB_0052849f:
  if (0 < (int)uVar5) {
    local_38 = (DAngle)dir->Degrees;
    P_DrawSplash2(0x28,&local_58,&local_38,2,kind);
  }
  return;
}

Assistant:

void P_SpawnBlood (const DVector3 &pos1, DAngle dir, int damage, AActor *originator)
{
	AActor *th;
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType();
	DVector3 pos = pos1;
	pos.Z += pr_spawnblood.Random2() / 64.;

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		th = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		th->Vel.Z = 2;
		th->Angles.Yaw = dir;
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = originator;
		if (gameinfo.gametype & GAME_DoomChex)
		{
			th->tics -= pr_spawnblood() & 3;

			if (th->tics < 1)
				th->tics = 1;
		}
		// colorize the blood
		if (bloodcolor != 0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}
		
		// Moved out of the blood actor so that replacing blood is easier
		if (gameinfo.gametype & GAME_DoomStrifeChex)
		{
			if (gameinfo.gametype == GAME_Strife)
			{
				if (damage > 13)
				{
					FState *state = th->FindState(NAME_Spray);
					if (state != NULL)
					{
						th->SetState (state);
						goto statedone;
					}
				}
				else damage += 2;
			}
			int advance = 0;
			if (damage <= 12 && damage >= 9)
			{
				advance = 1;
			}
			else if (damage < 9)
			{
				advance = 2;
			}

			PClassActor *cls = th->GetClass();

			while (cls != RUNTIME_CLASS(AActor))
			{
				int checked_advance = advance;
				if (cls->OwnsState(th->SpawnState))
				{
					for (; checked_advance > 0; --checked_advance)
					{
						// [RH] Do not set to a state we do not own.
						if (cls->OwnsState(th->SpawnState + checked_advance))
						{
							th->SetState(th->SpawnState + checked_advance);
							goto statedone;
						}
					}
				}
				// We can safely assume the ParentClass is of type PClassActor
				// since we stop when we see the Actor base class.
				cls = static_cast<PClassActor *>(cls->ParentClass);
			}
		}

	statedone:
		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}

	if (bloodtype >= 1)
		P_DrawSplash2 (40, pos, dir, 2, bloodcolor);
}